

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O1

void __thiscall
LM_Error_Value::tagCells1
          (LM_Error_Value *this,int *tag,int *tlo,int *thi,int *tagval,int *clearval,int *lo,int *hi
          ,int *domain_lo,int *domain_hi,Real *dx,Real *xlo,Real *prob_lo,Real *time,int *level)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  
  if (this->max_level < 0) {
    bVar2 = false;
  }
  else {
    bVar2 = this->max_level <= *level;
  }
  dVar1 = this->min_time;
  if ((dVar1 < 0.0) || (this->max_time < 0.0)) {
    bVar3 = false;
  }
  else {
    bVar3 = dVar1 <= this->max_time;
  }
  if ((!bVar3) || (*time < dVar1)) {
    bVar4 = false;
  }
  else {
    bVar4 = *time <= this->max_time;
  }
  if (0.0 <= dVar1 && !bVar3) {
    bVar5 = dVar1 <= *time;
  }
  else {
    bVar5 = false;
  }
  bVar6 = true;
  if ((!bVar3) && (0.0 <= this->max_time)) {
    bVar6 = this->max_time < *time;
  }
  if ((bool)(bVar4 | bVar5)) {
    bVar3 = false;
  }
  else {
    bVar3 = (bool)(bVar3 & bVar6);
  }
  if (!bVar2 && !bVar3) {
    (*this->lmef_box)(tag,tlo,thi,tagval,clearval,(this->box).xlo,(this->box).xhi,lo,hi,domain_lo,
                      domain_hi,dx,xlo,prob_lo,time,level);
  }
  return;
}

Assistant:

void
LM_Error_Value::tagCells1(int* tag, const int* tlo, const int* thi,
                          const int* tagval, const int* clearval,
                          const int* lo, const int* hi,
                          const int* domain_lo, const int* domain_hi,
                          const Real* dx, const Real* xlo,
                          const Real* prob_lo, const Real* time,
                          const int* level) const
{
    AMREX_ASSERT(lmef_box);

    bool max_level_applies = ( (max_level < 0) || ( *level < max_level ) );
    bool valid_time_range = (min_time >= 0) && (max_time >= 0) && (min_time <= max_time);
    bool in_valid_time_range = valid_time_range && (*time >= min_time ) && (*time <= max_time);
    bool one_side_lo = !valid_time_range && (min_time >= 0) && (*time >= min_time);
    bool one_side_hi = !valid_time_range && (max_time >= 0) && (*time <= max_time);
    bool time_window_applies = in_valid_time_range || one_side_lo || one_side_hi || !valid_time_range;

    if (max_level_applies && time_window_applies)
    {
      lmef_box(tag, AMREX_ARLIM_ANYD(tlo), AMREX_ARLIM_ANYD(thi),
               tagval, clearval,
               AMREX_ZFILL(box.lo()), AMREX_ZFILL(box.hi()),
               lo, hi, domain_lo, domain_hi, dx, xlo, prob_lo, time, level);
    }
}